

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O2

void re2::SetUnanchoredDollar(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  Set s;
  LogMessageFatal local_190;
  
  RE2::Options::Options((Options *)&local_190,DefaultOptions);
  RE2::Set::Set(&s,(Options *)&local_190,UNANCHORED);
  local_190.super_LogMessage._0_8_ = "foo$";
  local_190.super_LogMessage._8_4_ = 4;
  iVar2 = RE2::Set::Add(&s,(StringPiece *)&local_190,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4d);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Add(\"foo$\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  bVar1 = RE2::Set::Compile(&s);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x4e);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_190.super_LogMessage._0_8_ = "foo";
  local_190.super_LogMessage._8_4_ = 3;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x50);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foo\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_190.super_LogMessage._0_8_ = "foo";
  local_190.super_LogMessage._8_4_ = 3;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x53);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foo\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x54);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x55);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  RE2::Set::~Set(&s);
  return;
}

Assistant:

TEST(Set, UnanchoredDollar) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo$", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foo", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foo", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}